

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathMultValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr pxVar1;
  int code;
  double dVar2;
  
  pxVar1 = xmlXPathValuePop(ctxt);
  if (pxVar1 == (xmlXPathObjectPtr)0x0) {
    code = 10;
  }
  else {
    dVar2 = xmlXPathCastToNumberInternal(ctxt,pxVar1);
    xmlXPathReleaseObject(ctxt->context,pxVar1);
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathNumberFunction(ctxt,1);
    }
    pxVar1 = ctxt->value;
    if ((pxVar1 != (xmlXPathObjectPtr)0x0) && (pxVar1->type == XPATH_NUMBER)) {
      pxVar1->floatval = dVar2 * pxVar1->floatval;
      return;
    }
    code = 0xb;
  }
  xmlXPathErr(ctxt,code);
  return;
}

Assistant:

void
xmlXPathMultValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg;
    double val;

    arg = xmlXPathValuePop(ctxt);
    if (arg == NULL)
	XP_ERROR(XPATH_INVALID_OPERAND);
    val = xmlXPathCastToNumberInternal(ctxt, arg);
    xmlXPathReleaseObject(ctxt->context, arg);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    ctxt->value->floatval *= val;
}